

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

int array_container_get_index(array_container_t *arr,uint16_t x)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  
  if (arr->cardinality < 1) {
    return -1;
  }
  iVar4 = arr->cardinality + -1;
  uVar3 = 0;
  do {
    uVar2 = iVar4 + uVar3 >> 1;
    uVar1 = *(ushort *)((long)arr->array + (ulong)(iVar4 + uVar3 & 0xfffffffe));
    if (uVar1 < x) {
      uVar3 = uVar2 + 1;
    }
    else {
      if (uVar1 <= x) {
        return uVar2;
      }
      iVar4 = uVar2 - 1;
    }
  } while ((int)uVar3 <= iVar4);
  return ~((int)uVar3 >> 0x1f & uVar3);
}

Assistant:

inline int array_container_get_index(const array_container_t *arr, uint16_t x) {
    const int32_t idx = binarySearch(arr->array, arr->cardinality, x);
    const bool is_present = idx >= 0;
    if (is_present) {
        return idx;
    } else {
        return -1;
    }
}